

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O0

_Bool cpu_handle_interrupt(CPUState *cpu,TranslationBlock **last_tb)

{
  CPUClass *pCVar1;
  _Bool _Var2;
  CPUNegativeOffsetState_conflict5 *pCVar3;
  uint local_2c;
  int interrupt_request;
  CPUClass *cc;
  TranslationBlock **last_tb_local;
  CPUState *cpu_local;
  
  pCVar1 = cpu->cc;
  pCVar3 = cpu_neg(cpu);
  (pCVar3->icount_decr).u16.high = 0;
  if (cpu->interrupt_request != 0) {
    local_2c = cpu->interrupt_request;
    if ((cpu->singlestep_enabled & 2U) != 0) {
      local_2c = local_2c & 0xffffeda5;
    }
    if ((local_2c & 0x80) != 0) {
      cpu->interrupt_request = cpu->interrupt_request & 0xffffff7f;
      cpu->exception_index = 0x10002;
      return true;
    }
    if ((local_2c & 0x400) != 0) {
      cpu_reset(cpu);
      return true;
    }
    _Var2 = (*pCVar1->cpu_exec_interrupt)((CPUState_conflict *)cpu,local_2c);
    if (_Var2) {
      cpu->exception_index = -1;
      *last_tb = (TranslationBlock *)0x0;
    }
    if ((cpu->interrupt_request & 4) != 0) {
      cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
      *last_tb = (TranslationBlock *)0x0;
    }
  }
  if ((cpu->exit_request & 1U) == 0) {
    cpu_local._7_1_ = false;
  }
  else {
    cpu->exit_request = false;
    if (cpu->exception_index == -1) {
      cpu->exception_index = 0x10000;
    }
    cpu_local._7_1_ = true;
  }
  return cpu_local._7_1_;
}

Assistant:

static inline bool cpu_handle_interrupt(CPUState *cpu,
                                        TranslationBlock **last_tb)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);

    /* Clear the interrupt flag now since we're processing
     * cpu->interrupt_request and cpu->exit_request.
     * Ensure zeroing happens before reading cpu->exit_request or
     * cpu->interrupt_request (see also smp_wmb in cpu_exit())
     */
    cpu_neg(cpu)->icount_decr.u16.high = 0;

    if (unlikely(cpu->interrupt_request)) {
        int interrupt_request;
        interrupt_request = cpu->interrupt_request;
        if (unlikely(cpu->singlestep_enabled & SSTEP_NOIRQ)) {
            /* Mask out external interrupts for this step. */
            interrupt_request &= ~CPU_INTERRUPT_SSTEP_MASK;
        }
        if (interrupt_request & CPU_INTERRUPT_DEBUG) {
            cpu->interrupt_request &= ~CPU_INTERRUPT_DEBUG;
            cpu->exception_index = EXCP_DEBUG;
            return true;
        }
#if defined(TARGET_I386)
        else if (interrupt_request & CPU_INTERRUPT_INIT) {
            X86CPU *x86_cpu = X86_CPU(cpu);
            CPUArchState *env = &x86_cpu->env;
            //replay_interrupt();
            cpu_svm_check_intercept_param(env, SVM_EXIT_INIT, 0, 0);
            do_cpu_init(x86_cpu);
            cpu->exception_index = EXCP_HALTED;
            return true;
        }
#else
        else if (interrupt_request & CPU_INTERRUPT_RESET) {
            //replay_interrupt();
            cpu_reset(cpu);
            return true;
        }
#endif
        /* The target hook has 3 exit conditions:
           False when the interrupt isn't processed,
           True when it is, and we should restart on a new TB,
           and via longjmp via cpu_loop_exit.  */
        else {
            if (cc->cpu_exec_interrupt(cpu, interrupt_request)) {
                //replay_interrupt();
                cpu->exception_index = -1;
                *last_tb = NULL;
            }
            /* The target hook may have updated the 'cpu->interrupt_request';
             * reload the 'interrupt_request' value */
            interrupt_request = cpu->interrupt_request;
        }
        if (interrupt_request & CPU_INTERRUPT_EXITTB) {
            cpu->interrupt_request &= ~CPU_INTERRUPT_EXITTB;
            /* ensure that no TB jump will be modified as
               the program flow was changed */
            *last_tb = NULL;
        }
    }

    /* Finally, check if we need to exit to the main loop.  */
    if (unlikely(cpu->exit_request)) {
        cpu->exit_request = 0;
        if (cpu->exception_index == -1) {
            cpu->exception_index = EXCP_INTERRUPT;
        }
        return true;
    }

    return false;
}